

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_tables.cpp
# Opt level: O2

void ImGui::TableSetupDrawChannels(ImGuiTable *table)

{
  ImVec2 IVar1;
  ImVec2 IVar2;
  ImVec2 IVar3;
  ImGuiTableDrawChannelIdx IVar4;
  ImGuiTableColumn *pIVar5;
  char cVar6;
  ImGuiTableDrawChannelIdx IVar7;
  int column_n;
  int iVar8;
  int iVar9;
  bool bVar10;
  
  iVar9 = 1;
  if ((table->Flags & 0x80000) == 0) {
    iVar9 = (int)table->ColumnsEnabledCount;
  }
  bVar10 = true;
  if (table->ColumnsCount <= (int)table->ColumnsEnabledCount) {
    bVar10 = table->VisibleMaskByIndex != table->EnabledMaskByIndex;
  }
  iVar8 = ('\0' < table->FreezeRowsCount | 2) + (uint)bVar10 +
          (iVar9 << ('\0' < table->FreezeRowsCount));
  ImDrawListSplitter::Split(&table->DrawSplitter,table->InnerWindow->DrawList,iVar8);
  IVar4 = 0xff;
  if (bVar10 != false) {
    IVar4 = (char)iVar8 + 0xff;
  }
  table->DummyDrawChannel = IVar4;
  table->Bg2DrawChannelCurrent = '\x01';
  IVar4 = (char)iVar9 + '\x02';
  if (table->FreezeRowsCount < '\x01') {
    IVar4 = '\x01';
  }
  table->Bg2DrawChannelUnfrozen = IVar4;
  IVar4 = '\x02';
  for (iVar8 = 0; iVar8 < table->ColumnsCount; iVar8 = iVar8 + 1) {
    pIVar5 = ImSpan<ImGuiTableColumn>::operator[](&table->Columns,iVar8);
    if ((pIVar5->IsVisibleX == true) && (pIVar5->IsVisibleY == true)) {
      pIVar5->DrawChannelFrozen = IVar4;
      cVar6 = '\0';
      if ('\0' < table->FreezeRowsCount) {
        cVar6 = (char)iVar9 + '\x01';
      }
      pIVar5->DrawChannelUnfrozen = cVar6 + IVar4;
      IVar7 = IVar4;
      IVar4 = IVar4 + ((table->Flags & 0x80000) == 0);
    }
    else {
      IVar7 = table->DummyDrawChannel;
      pIVar5->DrawChannelUnfrozen = IVar7;
      pIVar5->DrawChannelFrozen = IVar7;
    }
    pIVar5->DrawChannelCurrent = IVar7;
  }
  IVar1 = (table->InnerClipRect).Max;
  IVar2 = (table->HostClipRect).Min;
  IVar3 = (table->HostClipRect).Max;
  (table->BgClipRect).Min = (table->InnerClipRect).Min;
  (table->BgClipRect).Max = IVar1;
  IVar1 = (table->OuterWindow->ClipRect).Max;
  (table->Bg0ClipRectForDrawCmd).Min = (table->OuterWindow->ClipRect).Min;
  (table->Bg0ClipRectForDrawCmd).Max = IVar1;
  (table->Bg2ClipRectForDrawCmd).Min = IVar2;
  (table->Bg2ClipRectForDrawCmd).Max = IVar3;
  if ((table->BgClipRect).Min.y <= (table->BgClipRect).Max.y) {
    return;
  }
  __assert_fail("table->BgClipRect.Min.y <= table->BgClipRect.Max.y",
                "/workspace/llm4binary/github/license_all_cmakelists_25/aaronaanderson[P]pedal_live/external/imgui/imgui_tables.cpp"
                ,0x868,"void ImGui::TableSetupDrawChannels(ImGuiTable *)");
}

Assistant:

void ImGui::TableSetupDrawChannels(ImGuiTable* table)
{
    const int freeze_row_multiplier = (table->FreezeRowsCount > 0) ? 2 : 1;
    const int channels_for_row = (table->Flags & ImGuiTableFlags_NoClip) ? 1 : table->ColumnsEnabledCount;
    const int channels_for_bg = 1 + 1 * freeze_row_multiplier;
    const int channels_for_dummy = (table->ColumnsEnabledCount < table->ColumnsCount || table->VisibleMaskByIndex != table->EnabledMaskByIndex) ? +1 : 0;
    const int channels_total = channels_for_bg + (channels_for_row * freeze_row_multiplier) + channels_for_dummy;
    table->DrawSplitter.Split(table->InnerWindow->DrawList, channels_total);
    table->DummyDrawChannel = (ImGuiTableDrawChannelIdx)((channels_for_dummy > 0) ? channels_total - 1 : -1);
    table->Bg2DrawChannelCurrent = TABLE_DRAW_CHANNEL_BG2_FROZEN;
    table->Bg2DrawChannelUnfrozen = (ImGuiTableDrawChannelIdx)((table->FreezeRowsCount > 0) ? 2 + channels_for_row : TABLE_DRAW_CHANNEL_BG2_FROZEN);

    int draw_channel_current = 2;
    for (int column_n = 0; column_n < table->ColumnsCount; column_n++)
    {
        ImGuiTableColumn* column = &table->Columns[column_n];
        if (column->IsVisibleX && column->IsVisibleY)
        {
            column->DrawChannelFrozen = (ImGuiTableDrawChannelIdx)(draw_channel_current);
            column->DrawChannelUnfrozen = (ImGuiTableDrawChannelIdx)(draw_channel_current + (table->FreezeRowsCount > 0 ? channels_for_row + 1 : 0));
            if (!(table->Flags & ImGuiTableFlags_NoClip))
                draw_channel_current++;
        }
        else
        {
            column->DrawChannelFrozen = column->DrawChannelUnfrozen = table->DummyDrawChannel;
        }
        column->DrawChannelCurrent = column->DrawChannelFrozen;
    }

    // Initial draw cmd starts with a BgClipRect that matches the one of its host, to facilitate merge draw commands by default.
    // All our cell highlight are manually clipped with BgClipRect. When unfreezing it will be made smaller to fit scrolling rect.
    // (This technically isn't part of setting up draw channels, but is reasonably related to be done here)
    table->BgClipRect = table->InnerClipRect;
    table->Bg0ClipRectForDrawCmd = table->OuterWindow->ClipRect;
    table->Bg2ClipRectForDrawCmd = table->HostClipRect;
    IM_ASSERT(table->BgClipRect.Min.y <= table->BgClipRect.Max.y);
}